

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddNestedExtensions
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *filename,
          DescriptorProto *message_type,FileDescriptorProto *value)

{
  bool bVar1;
  int iVar2;
  DescriptorProto *in_RCX;
  string *in_RDX;
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *in_RSI;
  int i_1;
  int i;
  FileDescriptorProto *in_stack_000000c0;
  FieldDescriptorProto *in_stack_000000c8;
  string *in_stack_000000d0;
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *in_stack_000000d8;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  while( true ) {
    iVar3 = iVar4;
    iVar2 = DescriptorProto::nested_type_size((DescriptorProto *)0x55770c);
    if (iVar2 <= iVar4) {
      iVar4 = 0;
      while( true ) {
        iVar3 = iVar4;
        iVar2 = DescriptorProto::extension_size((DescriptorProto *)0x557779);
        if (iVar2 <= iVar4) {
          return true;
        }
        DescriptorProto::extension
                  ((DescriptorProto *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                   (int)((ulong)in_RSI >> 0x20));
        bVar1 = AddExtension(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0
                            );
        if (!bVar1) break;
        iVar4 = iVar3 + 1;
      }
      return false;
    }
    DescriptorProto::nested_type
              ((DescriptorProto *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    bVar1 = AddNestedExtensions(in_RSI,in_RDX,in_RCX,
                                (FileDescriptorProto *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
    if (!bVar1) break;
    iVar4 = iVar3 + 1;
  }
  return false;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddNestedExtensions(
    const std::string& filename, const DescriptorProto& message_type,
    Value value) {
  for (int i = 0; i < message_type.nested_type_size(); i++) {
    if (!AddNestedExtensions(filename, message_type.nested_type(i), value))
      return false;
  }
  for (int i = 0; i < message_type.extension_size(); i++) {
    if (!AddExtension(filename, message_type.extension(i), value)) return false;
  }
  return true;
}